

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

void __thiscall
mapbox::detail::Earcut<long>::operator()
          (Earcut<long> *this,
          vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
          *points)

{
  undefined1 auVar1 [16];
  pointer plVar2;
  pointer pvVar3;
  pointer pvVar4;
  Node *outerNode;
  Node *pNVar5;
  pointer *ppMVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  
  plVar2 = (this->indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar2) {
    (this->indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar2;
  }
  this->vertices = 0;
  pvVar3 = (points->
           super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (points->
           super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar3 != pvVar4) {
    ppMVar6 = &(pvVar3->
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    uVar9 = 0x50;
    lVar11 = 0;
    for (uVar7 = 0;
        (iVar8 = (int)uVar9, -1 < iVar8 && (uVar7 < (ulong)(((long)pvVar4 - (long)pvVar3) / 0x18)));
        uVar7 = uVar7 + 1) {
      lVar10 = (long)*ppMVar6 - (long)((_Vector_impl_data *)(ppMVar6 + -1))->_M_start >> 4;
      uVar9 = (ulong)(uint)(iVar8 - (int)lVar10);
      lVar11 = lVar11 + lVar10;
      ppMVar6 = ppMVar6 + 3;
    }
    ObjectPool<mapbox::detail::Earcut<long>::Node,_std::allocator<mapbox::detail::Earcut<long>::Node>_>
    ::reset(&this->nodes,(ulong)(lVar11 * 3) >> 1);
    pvVar3 = (points->
             super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::vector<long,_std::allocator<long>_>::reserve
              (&this->indices,
               ((long)*(pointer *)
                       ((long)&(pvVar3->
                               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                               )._M_impl.super__Vector_impl_data + 8) -
                *(long *)&(pvVar3->
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          )._M_impl.super__Vector_impl_data >> 4) + lVar11);
    outerNode = linkedList<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
                          (this,(points->
                                super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,true);
    if (outerNode != (Node *)0x0) {
      if (1 < (ulong)(((long)(points->
                             super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(points->
                            super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        outerNode = eliminateHoles<std::vector<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>,std::allocator<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>>>
                              (this,points,outerNode);
      }
      this->hashing = SUB81(uVar9 >> 0x1f,0);
      if (iVar8 < 0) {
        pNVar5 = outerNode->next;
        auVar13._0_8_ = outerNode->x;
        auVar13._8_8_ = outerNode->y;
        auVar15 = auVar13;
        do {
          auVar1._0_8_ = pNVar5->x;
          auVar1._8_8_ = pNVar5->y;
          auVar15 = minpd(auVar1,auVar15);
          auVar13 = maxpd(auVar1,auVar13);
          pNVar5 = pNVar5->next;
        } while (pNVar5 != outerNode);
        this->minX = auVar15._0_8_;
        this->maxX = auVar13._0_8_;
        this->minY = auVar15._8_8_;
        this->maxY = auVar13._8_8_;
        dVar12 = auVar13._0_8_ - auVar15._0_8_;
        dVar14 = auVar13._8_8_ - auVar15._8_8_;
        if (dVar14 <= dVar12) {
          dVar14 = dVar12;
        }
        this->inv_size = (double)(-(ulong)(dVar14 != 0.0) & (ulong)(1.0 / dVar14));
      }
      earcutLinked(this,outerNode,0);
      ObjectPool<mapbox::detail::Earcut<long>::Node,_std::allocator<mapbox::detail::Earcut<long>::Node>_>
      ::clear(&this->nodes);
      return;
    }
  }
  return;
}

Assistant:

void Earcut<N>::operator()(const Polygon& points) {
    // reset
    indices.clear();
    vertices = 0;

    if (points.empty()) return;

    double x;
    double y;
    int threshold = 80;
    std::size_t len = 0;

    for (size_t i = 0; threshold >= 0 && i < points.size(); i++) {
        threshold -= static_cast<int>(points[i].size());
        len += points[i].size();
    }

    //estimate size of nodes and indices
    nodes.reset(len * 3 / 2);
    indices.reserve(len + points[0].size());

    Node* outerNode = linkedList(points[0], true);
    if (!outerNode) return;

    if (points.size() > 1) outerNode = eliminateHoles(points, outerNode);

    // if the shape is not too simple, we'll use z-order curve hash later; calculate polygon bbox
    hashing = threshold < 0;
    if (hashing) {
        Node* p = outerNode->next;
        minX = maxX = outerNode->x;
        minY = maxY = outerNode->y;
        do {
            x = p->x;
            y = p->y;
            minX = std::min<double>(minX, x);
            minY = std::min<double>(minY, y);
            maxX = std::max<double>(maxX, x);
            maxY = std::max<double>(maxY, y);
            p = p->next;
        } while (p != outerNode);

        // minX, minY and size are later used to transform coords into integers for z-order calculation
        inv_size = std::max<double>(maxX - minX, maxY - minY);
        inv_size = inv_size != .0 ? (1. / inv_size) : .0;
    }

    earcutLinked(outerNode);

    nodes.clear();
}